

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rpc_request.cc
# Opt level: O2

int __thiscall AliRpcRequest::CommitRequest(AliRpcRequest *this)

{
  int iVar1;
  string sign_url;
  string sign;
  allocator<char> local_26a;
  allocator<char> local_269;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  GetSignUrl_abi_cxx11_(&local_268,this);
  std::operator+(&local_48,&this->secret_,"&");
  encode_compute_hmac_sha1
            (&local_28,&local_48,local_268._M_dataplus._M_p,(int)local_268._M_string_length);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"TimeStamp",&local_26a);
  std::__cxx11::string::string((string *)&local_88,(string *)&this->utc_time_);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Format",&local_26a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"JSON",&local_269);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Version",&local_26a);
  std::__cxx11::string::string((string *)&local_108,(string *)&this->version_);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"AccessKeyId",&local_26a);
  std::__cxx11::string::string((string *)&local_148,(string *)&this->appid_);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_128,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"SignatureMethod",&local_26a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"HMAC-SHA1",&local_269);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_168,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"SignatureVersion",&local_26a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"1.0",&local_269);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_1a8,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"SignatureNonce",&local_26a);
  std::__cxx11::string::string((string *)&local_208,(string *)&this->sign_nounce);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_1e8,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"Signature",&local_26a);
  std::__cxx11::string::string((string *)&local_248,(string *)&local_28);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_228,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  iVar1 = AliHttpRequest::CommitRequest(&this->super_AliHttpRequest);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_268);
  return iVar1;
}

Assistant:

int AliRpcRequest::CommitRequest() {
  std::string sign_url = GetSignUrl();
  std::string sign = encode_compute_hmac_sha1(this->secret_ + "&", 
                                              (char*)sign_url.c_str(),
                                              sign_url.size());
  AddRequestQuery("TimeStamp", utc_time_);
  AddRequestQuery("Format", "JSON");
  AddRequestQuery("Version", this->version_);
  AddRequestQuery("AccessKeyId", this->appid_);
  AddRequestQuery("SignatureMethod", "HMAC-SHA1");    
  AddRequestQuery("SignatureVersion", "1.0"); 
  AddRequestQuery("SignatureNonce", this->sign_nounce);
  AddRequestQuery("Signature", sign);
  return AliHttpRequest::CommitRequest();
}